

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BronKerbosch.cpp
# Opt level: O0

void __thiscall BronKerbosch::~BronKerbosch(BronKerbosch *this)

{
  AlignmentRecord *pAVar1;
  bool bVar2;
  reference ppAVar3;
  CliqueFinder *in_RDI;
  AlignmentRecord **alignment;
  iterator __end1;
  iterator __begin1;
  vector<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_> *__range1;
  vector<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_> *in_stack_ffffffffffffffb8;
  clique_list_t *pcVar4;
  AlignmentRecord *in_stack_ffffffffffffffc0;
  void *pvVar5;
  __normal_iterator<AlignmentRecord_**,_std::vector<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_>_>
  local_18;
  CliqueFinder *local_10;
  
  (((_Vector_base<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
     *)&in_RDI->_vptr_CliqueFinder)->_M_impl).super__Vector_impl_data._M_start =
       (pointer)&PTR__BronKerbosch_00352c88;
  if (in_RDI->cliques != (clique_list_t *)0x0) {
    (**(code **)&(((_Vector_base<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                    *)&in_RDI->_vptr_CliqueFinder)->_M_impl).super__Vector_impl_data._M_start[1].
                 m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl)()
    ;
  }
  local_10 = in_RDI + 1;
  local_18._M_current =
       (AlignmentRecord **)
       std::vector<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_>::begin
                 (in_stack_ffffffffffffffb8);
  std::vector<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_>::end(in_stack_ffffffffffffffb8)
  ;
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      ((__normal_iterator<AlignmentRecord_**,_std::vector<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_>_>
                        *)in_stack_ffffffffffffffc0,
                       (__normal_iterator<AlignmentRecord_**,_std::vector<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_>_>
                        *)in_stack_ffffffffffffffb8);
    if (!bVar2) break;
    ppAVar3 = __gnu_cxx::
              __normal_iterator<AlignmentRecord_**,_std::vector<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_>_>
              ::operator*(&local_18);
    pAVar1 = *ppAVar3;
    if (pAVar1 != (AlignmentRecord *)0x0) {
      AlignmentRecord::~AlignmentRecord(in_stack_ffffffffffffffc0);
      operator_delete(pAVar1);
    }
    __gnu_cxx::
    __normal_iterator<AlignmentRecord_**,_std::vector<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_>_>
    ::operator++(&local_18);
  }
  pvVar5 = *(void **)&in_RDI[1].initialized;
  if (pvVar5 != (void *)0x0) {
    std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::~list
              ((list<unsigned_long,_std::allocator<unsigned_long>_> *)0x255a1d);
    operator_delete(pvVar5);
  }
  pcVar4 = in_RDI[1].cliques;
  if (pcVar4 != (clique_list_t *)0x0) {
    std::
    vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
    ::~vector((vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
               *)in_RDI);
    operator_delete(pcVar4);
  }
  std::vector<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_>::~vector
            ((vector<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_> *)in_RDI);
  CliqueFinder::~CliqueFinder(in_RDI);
  return;
}

Assistant:

BronKerbosch::~BronKerbosch() {
    if (cliques != nullptr) {
        finish();
    }
    for (auto&& alignment : alignments_) {
        delete alignment;
    }
    delete order_;
    delete vertices_;
}